

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

bool __thiscall
wallet::OutputGroup::EligibleForSpending
          (OutputGroup *this,CoinEligibilityFilter *eligibility_filter)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if ((this->m_depth < (&eligibility_filter->conf_mine)[this->m_from_me ^ 1]) ||
     (eligibility_filter->max_ancestors < this->m_ancestors)) {
    bVar1 = false;
  }
  else {
    bVar1 = this->m_descendants <= eligibility_filter->max_descendants;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool OutputGroup::EligibleForSpending(const CoinEligibilityFilter& eligibility_filter) const
{
    return m_depth >= (m_from_me ? eligibility_filter.conf_mine : eligibility_filter.conf_theirs)
        && m_ancestors <= eligibility_filter.max_ancestors
        && m_descendants <= eligibility_filter.max_descendants;
}